

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::unkeyframe(Mesh *this,double t)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  _Self __tmp;
  _Rb_tree_node_base *p_Var6;
  double dVar7;
  double dVar8;
  
  if ((this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var1 = &(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4 && bVar3]) {
      bVar3 = t != *(double *)(p_Var2 + 1);
      bVar4 = *(double *)(p_Var2 + 1) <= t;
      if (!bVar4 || !bVar3) {
        p_Var6 = p_Var2;
      }
    }
    iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var6);
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      p_Var6 = iVar5._M_node;
    }
    dVar8 = ABS(*(double *)(iVar5._M_node + 1) - t);
    dVar7 = ABS(*(double *)(p_Var6 + 1) - t);
    if (((dVar8 < 0.1) && (dVar8 < dVar7)) ||
       ((dVar7 < 0.1 && (iVar5._M_node = p_Var6, dVar7 < dVar8)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).positions,iVar5);
    }
  }
  if ((this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var1 = &(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4 && bVar3]) {
      bVar3 = t != *(double *)(p_Var2 + 1);
      bVar4 = *(double *)(p_Var2 + 1) <= t;
      if (!bVar4 || !bVar3) {
        p_Var6 = p_Var2;
      }
    }
    iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var6);
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      p_Var6 = iVar5._M_node;
    }
    dVar8 = ABS(*(double *)(iVar5._M_node + 1) - t);
    dVar7 = ABS(*(double *)(p_Var6 + 1) - t);
    if (((dVar8 < 0.1) && (dVar8 < dVar7)) ||
       ((dVar7 < 0.1 && (iVar5._M_node = p_Var6, dVar7 < dVar8)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).rotations,iVar5);
    }
  }
  if ((this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  {
    p_Var1 = &(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4 && bVar3]) {
      bVar3 = t != *(double *)(p_Var2 + 1);
      bVar4 = *(double *)(p_Var2 + 1) <= t;
      if (!bVar4 || !bVar3) {
        p_Var6 = p_Var2;
      }
    }
    iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var6);
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      p_Var6 = iVar5._M_node;
    }
    dVar8 = ABS(*(double *)(iVar5._M_node + 1) - t);
    dVar7 = ABS(*(double *)(p_Var6 + 1) - t);
    if (((dVar8 < 0.1) && (dVar8 < dVar7)) ||
       ((dVar7 < 0.1 && (iVar5._M_node = p_Var6, dVar7 < dVar8)))) {
      std::
      _Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,CMU462::Vector3D>,std::_Select1st<std::pair<double_const,CMU462::Vector3D>>,std::less<double>,std::allocator<std::pair<double_const,CMU462::Vector3D>>>
                          *)&(this->super_SceneObject).scales,iVar5);
    }
  }
  if (this->skeleton != (Skeleton *)0x0) {
    Skeleton::unkeyframe(this->skeleton,t);
    return;
  }
  return;
}

Assistant:

void Mesh::unkeyframe(double t) {
  positions.removeKnot(t, 0.1);
  rotations.removeKnot(t, 0.1);
  scales.removeKnot(t, 0.1);
  if (skeleton) skeleton->unkeyframe(t); 
}